

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
__thiscall ninx::parser::Parser::parse_statement(Parser *this)

{
  TokenReader *this_00;
  long *plVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  Token *pTVar5;
  Text *this_01;
  Limiter *this_02;
  Variable *this_03;
  string *psVar6;
  VariableRead *this_04;
  TextElement *this_05;
  ulong uVar7;
  long in_RSI;
  long *plVar8;
  long *plVar9;
  string name;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  value;
  undefined1 local_60 [40];
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> local_38;
  
  this_00 = (TokenReader *)(in_RSI + 0x20);
  pTVar5 = TokenReader::get_token(this_00);
  if (pTVar5 == (Token *)0x0) {
switchD_00147a3a_caseD_2:
    (this->origin)._M_dataplus._M_p = (pointer)0x0;
    return (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
            )this;
  }
  iVar4 = (*pTVar5->_vptr_Token[2])(pTVar5);
  switch(iVar4) {
  case 0:
    this_01 = (Text *)__dynamic_cast(pTVar5,&lexer::token::Token::typeinfo,
                                     &lexer::token::Text::typeinfo,0);
    psVar6 = lexer::token::Text::get_text_abi_cxx11_(this_01);
    this_05 = (TextElement *)operator_new(0x38);
    element::TextElement::TextElement(this_05,psVar6);
    goto LAB_00147d11;
  case 1:
    this_02 = (Limiter *)
              __dynamic_cast(pTVar5,&lexer::token::Token::typeinfo,&lexer::token::Limiter::typeinfo,
                             0);
    cVar3 = lexer::token::Limiter::get_limiter(this_02);
    uVar7 = (ulong)(long)cVar3 % *(ulong *)(in_RSI + 0x38);
    plVar8 = *(long **)(*(long *)(in_RSI + 0x30) + uVar7 * 8);
    plVar9 = (long *)0x0;
    if ((plVar8 != (long *)0x0) &&
       (plVar1 = (long *)*plVar8, plVar9 = plVar8, cVar3 != *(char *)((long *)*plVar8 + 1))) {
      while (plVar8 = plVar1, plVar1 = (long *)*plVar8, plVar1 != (long *)0x0) {
        plVar9 = (long *)0x0;
        if (((ulong)(long)(char)plVar1[1] % *(ulong *)(in_RSI + 0x38) != uVar7) ||
           (plVar9 = plVar8, cVar3 == (char)plVar1[1])) goto LAB_00147c8d;
      }
      plVar9 = (long *)0x0;
    }
LAB_00147c8d:
    if ((plVar9 != (long *)0x0) && (*plVar9 != 0)) {
      TokenReader::seek_previous(this_00);
      parse_operator_call((Parser *)local_60,(char)in_RSI);
      break;
    }
    local_60._0_8_ = local_60 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_60,'\x01');
    this_05 = (TextElement *)operator_new(0x38);
    element::TextElement::TextElement(this_05,(string *)local_60);
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
LAB_00147d11:
    (this->origin)._M_dataplus._M_p = (pointer)this_05;
    return (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
            )this;
  default:
    goto switchD_00147a3a_caseD_2;
  case 3:
    this_03 = (Variable *)
              __dynamic_cast(pTVar5,&lexer::token::Token::typeinfo,&lexer::token::Variable::typeinfo
                             ,0);
    psVar6 = lexer::token::Variable::get_name_abi_cxx11_(this_03);
    pcVar2 = (psVar6->_M_dataplus)._M_p;
    local_60._0_8_ = local_60 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar2,pcVar2 + psVar6->_M_string_length);
    iVar4 = TokenReader::check_limiter(this_00,'=');
    if (iVar4 == 1) {
      TokenReader::get_token(this_00);
      parse_level_3_expression((Parser *)(local_60 + 0x20));
      this_04 = (VariableRead *)operator_new(0x40);
      local_38._M_head_impl = (Expression *)local_60._32_8_;
      local_60._32_8_ = (Expression *)0x0;
      element::Assignment::Assignment
                ((Assignment *)this_04,(string *)local_60,
                 (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                  *)&local_38);
      if (local_38._M_head_impl != (Expression *)0x0) {
        (*(code *)(((_Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                     *)&(local_38._M_head_impl)->super_Statement)->_M_impl).super__Vector_impl_data.
                  _M_start[1]._M_t.
                  super___uniq_ptr_impl<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                  ._M_t)();
      }
    }
    else {
      iVar4 = lexer::token::Variable::get_trailing_spaces(this_03);
      this_04 = (VariableRead *)operator_new(0x40);
      element::VariableRead::VariableRead(this_04,(string *)local_60,iVar4);
    }
    (this->origin)._M_dataplus._M_p = (pointer)this_04;
    if ((undefined1 *)local_60._0_8_ == local_60 + 0x10) {
      return (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
              )this;
    }
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    return (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
            )this;
  case 4:
    TokenReader::seek_previous(this_00);
    parse_function_call((Parser *)local_60);
    break;
  case 5:
    parse_function_definition((Parser *)local_60);
    break;
  case 6:
    parse_operator_definition((Parser *)local_60);
    break;
  case 7:
    TokenReader::seek_previous(this_00);
    parse_if_statement((Parser *)local_60);
    break;
  case 10:
    TokenReader::seek_previous(this_00);
    parse_for_statement((Parser *)local_60);
  }
  (this->origin)._M_dataplus._M_p = (pointer)local_60._0_8_;
  return (__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Statement> ninx::parser::Parser::parse_statement() {
    Token *token{reader.get_token()};

    if (token) {
        switch (token->get_type()) {
            case Type::FUNCDEF: {
                return parse_function_definition();
            }
            case Type::OPDEF: {
                return parse_operator_definition();
            }
            case Type::VARIABLE: {
                auto variable_token {dynamic_cast<ninx::lexer::token::Variable *>(token)};
                // Get the variable name
                auto name{variable_token->get_name()};

                // Determine if the variable is used in an assignment by peeking the next
                // token and checking if it is a limiter equal to =
                if (reader.check_limiter('=') == 1) {  // Assignment
                    // Skip the = limiter
                    reader.get_token();

                    auto value = parse_expression();

                    auto element = std::make_unique<ninx::parser::element::Assignment>(name, std::move(value));
                    return element;
                } else {  // Variable used as value
                    auto element = std::make_unique<ninx::parser::element::VariableRead>(name, variable_token->get_trailing_spaces());
                    return element;
                }
            }
            case Type::LIMITER: {
                auto limiter_token { dynamic_cast<ninx::lexer::token::Limiter *>(token) };
                char limiter {limiter_token->get_limiter()};

                if (operators.find(limiter) != operators.end()) {  // Operator found, parse it
                    reader.seek_previous();
                    return parse_operator_call(limiter);
                }else{  // Limiter not registered, default to a text element
                    auto element = std::make_unique<TextElement>(std::string(1, limiter));
                    return element;
                }
            }
            case Type::FUNCNAME: {
                reader.seek_previous();  // Seek to the previous token to make the function able to read it again
                return parse_function_call();
            }
            case Type::IF: {
                reader.seek_previous();  // Rewind the if block
                return parse_if_statement();
            }
            case Type::FOR: {
                reader.seek_previous();  // Rewind the for block
                return parse_for_statement();
            }
            case Type::TEXT: {
                auto element = std::make_unique<TextElement>(
                        dynamic_cast<ninx::lexer::token::Text *>(token)->get_text());
                return element;
            }
        }

        // TODO: throw parse exception for unexpected token
    }

    // End of the document
    return nullptr;
}